

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

double av1_highbd_estimate_noise_from_single_plane_c
                 (uint16_t *src16,int height,int width,int stride,int bit_depth,int edge_thresh)

{
  char cVar1;
  int iVar2;
  int iVar3;
  double local_90;
  int local_70;
  int v;
  int Ga;
  int Gy;
  int Gx;
  int idx;
  int jj;
  int ii;
  int mat [3] [3];
  int local_2c;
  long local_28;
  int center_idx;
  int j;
  int i;
  int count;
  int64_t accum;
  int edge_thresh_local;
  
  local_28 = 0;
  local_2c = 0;
  for (mat[2][2] = 1; mat[2][2] < height + -1; mat[2][2] = mat[2][2] + 1) {
    for (mat[2][1] = 1; mat[2][1] < width + -1; mat[2][1] = mat[2][1] + 1) {
      mat[2][0] = mat[2][2] * stride + mat[2][1];
      for (v = -1; v < 2; v = v + 1) {
        for (local_70 = -1; local_70 < 2; local_70 = local_70 + 1) {
          (&Ga)[(long)(v + 1) * 3 + (long)(local_70 + 1)] =
               (uint)src16[mat[2][0] + v * stride + local_70];
        }
      }
      iVar2 = (Ga - Gx) + (mat[0][0] - mat[0][2]) + (idx - ii) * 2;
      iVar3 = (Ga - mat[0][0]) + (Gx - mat[0][2]) + (Gy - mat[0][1]) * 2;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      cVar1 = (char)bit_depth;
      if (iVar2 + iVar3 + ((1 << (cVar1 - 8U & 0x1f)) >> 1) >> (cVar1 - 8U & 0x1f) < edge_thresh) {
        iVar2 = jj * 4 + (Gy + mat[0][1] + idx + ii) * -2 + Ga + Gx + mat[0][0] + mat[0][2];
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        local_28 = (iVar2 + ((1 << (cVar1 - 8U & 0x1f)) >> 1) >> (cVar1 - 8U & 0x1f)) + local_28;
        local_2c = local_2c + 1;
      }
    }
  }
  if (local_2c < 0x10) {
    local_90 = -1.0;
  }
  else {
    local_90 = ((double)local_28 / (double)(local_2c * 6)) * 1.25331413732;
  }
  return local_90;
}

Assistant:

double av1_highbd_estimate_noise_from_single_plane_c(const uint16_t *src16,
                                                     int height, int width,
                                                     const int stride,
                                                     int bit_depth,
                                                     int edge_thresh) {
  int64_t accum = 0;
  int count = 0;
  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src16[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), bit_depth - 8);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), bit_depth - 8);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}